

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::
HeapDisposer<kj::_::AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncTee::ReadSink>_>
::disposeImpl(HeapDisposer<kj::_::AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncTee::ReadSink>_>
              *this,void *pointer)

{
  void *pointer_local;
  HeapDisposer<kj::_::AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncTee::ReadSink>_>
  *this_local;
  
  if (pointer != (void *)0x0) {
    AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncTee::ReadSink>::
    ~AdapterPromiseNode((AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncTee::ReadSink>
                         *)pointer);
    operator_delete(pointer,0x1c8);
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }